

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O2

void __thiscall ChatWindow::connectedToServer(ChatWindow *this)

{
  QString newUsername;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  tr((QString *)&local_40,"Chose Username",(char *)0x0,-1);
  tr((QString *)&local_58,"Username",(char *)0x0,-1);
  local_28.d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  local_28.size = 0;
  QInputDialog::getText(&newUsername,this,&local_40,&local_58,0,&local_28,0,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (newUsername.d.size == 0) {
    ChatClient::disconnectFromHost(this->m_chatClient);
  }
  else {
    attemptLogin(this,&newUsername);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&newUsername.d);
  return;
}

Assistant:

void ChatWindow::connectedToServer()
{
    // once we connected to the server we ask the user for what username they would like to use
    const QString newUsername = QInputDialog::getText(this, tr("Chose Username"), tr("Username"));
    if (newUsername.isEmpty()){
        // if the user clicked cancel or typed nothing, we just disconnect from the server
        return m_chatClient->disconnectFromHost();
    }
    // try to login with the given username
    attemptLogin(newUsername);
}